

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_4f39de::FoldExpr::printLeft(FoldExpr *this,OutputStream *S)

{
  StringView R;
  StringView R_00;
  anon_class_16_2_d70826e2 PrintPack;
  
  PrintPack.S = S;
  PrintPack.this = this;
  OutputStream::operator+=(S,'(');
  if (this->IsLeftFold == true) {
    if (this->Init != (Node *)0x0) {
      Node::print(this->Init,S);
      OutputStream::operator+=(S,' ');
      OutputStream::operator+=(S,this->OperatorName);
      OutputStream::operator+=(S,' ');
    }
    R.Last = "";
    R.First = "... ";
    OutputStream::operator+=(S,R);
    OutputStream::operator+=(S,this->OperatorName);
    OutputStream::operator+=(S,' ');
    printLeft::anon_class_16_2_d70826e2::operator()(&PrintPack);
  }
  else {
    printLeft::anon_class_16_2_d70826e2::operator()(&PrintPack);
    OutputStream::operator+=(S,' ');
    OutputStream::operator+=(S,this->OperatorName);
    R_00.Last = "";
    R_00.First = " ...";
    OutputStream::operator+=(S,R_00);
    if (this->Init != (Node *)0x0) {
      OutputStream::operator+=(S,' ');
      OutputStream::operator+=(S,this->OperatorName);
      OutputStream::operator+=(S,' ');
      Node::print(this->Init,S);
    }
  }
  OutputStream::operator+=(S,')');
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    auto PrintPack = [&] {
      S += '(';
      ParameterPackExpansion(Pack).print(S);
      S += ')';
    };

    S += '(';

    if (IsLeftFold) {
      // init op ... op pack
      if (Init != nullptr) {
        Init->print(S);
        S += ' ';
        S += OperatorName;
        S += ' ';
      }
      // ... op pack
      S += "... ";
      S += OperatorName;
      S += ' ';
      PrintPack();
    } else { // !IsLeftFold
      // pack op ...
      PrintPack();
      S += ' ';
      S += OperatorName;
      S += " ...";
      // pack op ... op init
      if (Init != nullptr) {
        S += ' ';
        S += OperatorName;
        S += ' ';
        Init->print(S);
      }
    }
    S += ')';
  }